

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall QTabBarPrivate::slide(QTabBarPrivate *this,int from,int to)

{
  int *piVar1;
  Shape SVar2;
  QWidget *this_00;
  Tab *this_01;
  Representation RVar3;
  Representation RVar4;
  bool bVar5;
  QRect QVar6;
  QRect QVar7;
  Representation local_40;
  
  if ((((-1 < from && from != to) && (-1 < to)) &&
      ((ulong)(uint)from < (ulong)(this->tabList).d.size)) &&
     ((ulong)(uint)to < (ulong)(this->tabList).d.size)) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    SVar2 = this->shape;
    QVar6 = QTabBar::tabRect((QTabBar *)this_00,from);
    QWidget::setUpdatesEnabled(this_00,false);
    QTabBar::moveTab((QTabBar *)this_00,from,to);
    QWidget::setUpdatesEnabled(this_00,true);
    QVar7 = QTabBar::tabRect((QTabBar *)this_00,to);
    bVar5 = (SVar2 - RoundedWest & 0xfffffffa) != 0;
    local_40 = QVar6.x1.m_i;
    RVar4.m_i = QVar6.y1.m_i.m_i;
    if (bVar5) {
      RVar4.m_i = local_40.m_i;
    }
    RVar3.m_i = QVar7.y1.m_i.m_i;
    if (bVar5) {
      RVar3.m_i = QVar7.x1.m_i.m_i;
    }
    this_01 = (this->tabList).d.ptr[(uint)to];
    piVar1 = &this_01->dragOffset;
    *piVar1 = *piVar1 + (RVar4.m_i - RVar3.m_i);
    Tab::startAnimation(this_01,this,0xfa);
    return;
  }
  return;
}

Assistant:

void QTabBarPrivate::slide(int from, int to)
{
    Q_Q(QTabBar);
    if (from == to
            || !validIndex(from)
            || !validIndex(to))
        return;
    bool vertical = verticalTabs(shape);
    int preLocation = vertical ? q->tabRect(from).y() : q->tabRect(from).x();
    q->setUpdatesEnabled(false);
    q->moveTab(from, to);
    q->setUpdatesEnabled(true);
    int postLocation = vertical ? q->tabRect(to).y() : q->tabRect(to).x();
    int length = postLocation - preLocation;
    tabList.at(to)->dragOffset -= length;
    tabList.at(to)->startAnimation(this, ANIMATION_DURATION);
}